

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

expected<const_Command::Arg_*,_Commands::MatchFailure> *
match_arg(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
         Commands *commands,shared_ptr<const_SyntaxTree> *hint,float arg,Arg *arginfo,
         SymTable *symtable,shared_ptr<Scope> *scope_ptr,Options *options)

{
  char cVar1;
  MatchFailure MStack_48;
  MatchFailure local_30;
  
  if (((ulong)(hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr &
      0x800) == 0) {
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&MStack_48,
               (__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)commands);
    MStack_48.reason = LiteralValueDisallowed;
    Commands::MatchFailure::MatchFailure(&local_30,&MStack_48);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.context.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&MStack_48.context.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    cVar1 = *(char *)&(hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
    if ((cVar1 == '\x03') || (cVar1 == '\0')) {
      __return_storage_ptr__->has_value = true;
      (__return_storage_ptr__->contained).m_value = (value_type)hint;
    }
    else {
      make_expected_error(__return_storage_ptr__,(shared_ptr<const_SyntaxTree> *)commands,
                          (Arg *)hint);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static auto match_arg(const Commands& commands, const shared_ptr<const SyntaxTree>& hint,
                      float arg, const Command::Arg& arginfo, const SymTable& symtable,
                      const shared_ptr<Scope>& scope_ptr, const Options& options) -> expected<const Command::Arg*, MatchFailure>
{
    if(!arginfo.allow_constant)
        return make_unexpected(MatchFailure{ hint, MatchFailure::LiteralValueDisallowed });
    if(arginfo.type == ArgType::Float || arginfo.type == ArgType::Param)
        return &arginfo;
    return make_expected_error(hint, arginfo);
}